

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O1

void decode_fglrx_ioctl_4f(fglrx_ioctl_4f *d,mmt_memory_dump *args,int argc)

{
  mmt_buf *buf;
  
  if (fglrx_show_unk_zero_fields != 0 || d->unk00 != 0) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx);
  }
  fglrx_pfx = ", ";
  if (fglrx_show_unk_zero_fields != 0 || d->unk04 != 0) {
    fprintf(_stdout,"%sunk04: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (fglrx_show_unk_zero_fields != 0 || d->unk08 != 0) {
    fprintf(_stdout,"%sunk08: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (fglrx_show_unk_zero_fields != 0 || d->unk0c != 0) {
    fprintf(_stdout,"%sunk0c: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (fglrx_show_unk_zero_fields != 0 || d->unk10 != 0) {
    fprintf(_stdout,"%sunk10: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (fglrx_show_unk_zero_fields != 0 || d->unk14 != 0) {
    fprintf(_stdout,"%sunk14: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (fglrx_show_unk_zero_fields != 0 || d->unk18 != 0) {
    fprintf(_stdout,"%sunk18: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (fglrx_show_unk_zero_fields != 0 || d->unk1c != 0) {
    fprintf(_stdout,"%sunk1c: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (d->ptr1 == 0) {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr1: %s",", ","NULL");
  }
  else {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr1: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->ptr1,args,argc);
    }
    if (buf == (mmt_buf *)0x0) {
      fputs(" [no data]",_stdout);
      buf = (mmt_buf *)0x0;
    }
  }
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf,"ptr1[]:");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_4f(struct fglrx_ioctl_4f *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
}